

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCut.c
# Opt level: O3

void Lpk_NodePrintCut(Lpk_Man_t *p,Lpk_Cut_t *pCut,int fLeavesOnly)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void *pvVar3;
  ulong uVar4;
  
  if (fLeavesOnly == 0) {
    puts("LEAVES:");
  }
  if ((undefined1  [212])((undefined1  [212])*pCut & (undefined1  [212])0x3f) !=
      (undefined1  [212])0x0) {
    uVar4 = 0;
    do {
      iVar1 = pCut->pLeaves[uVar4];
      if (((long)iVar1 < 0) || (pVVar2 = p->pNtk->vObjs, pVVar2->nSize <= iVar1)) goto LAB_004755b7;
      printf("%d,",(ulong)*(uint *)((long)pVVar2->pArray[iVar1] + 0x10));
      uVar4 = uVar4 + 1;
    } while (uVar4 < (*(uint *)pCut & 0x3f));
  }
  if (fLeavesOnly != 0) {
    return;
  }
  puts("\nNODES:");
  if ((undefined1  [212])((undefined1  [212])*pCut & (undefined1  [212])0xfc0) !=
      (undefined1  [212])0x0) {
    uVar4 = 0;
    do {
      iVar1 = pCut->pNodes[uVar4];
      if (((long)iVar1 < 0) || (pVVar2 = p->pNtk->vObjs, pVVar2->nSize <= iVar1)) {
LAB_004755b7:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar3 = pVVar2->pArray[iVar1];
      printf("%d,",(ulong)*(uint *)((long)pvVar3 + 0x10));
      if ((*(uint *)((long)pvVar3 + 0x14) & 0xf) != 7) {
        __assert_fail("Abc_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCut.c"
                      ,0x1b4,"void Lpk_NodePrintCut(Lpk_Man_t *, Lpk_Cut_t *, int)");
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (*(uint *)pCut >> 6 & 0x3f));
  }
  putchar(10);
  return;
}

Assistant:

void Lpk_NodePrintCut( Lpk_Man_t * p, Lpk_Cut_t * pCut, int fLeavesOnly )
{
    Abc_Obj_t * pObj;
    int i;
    if ( !fLeavesOnly )
        printf( "LEAVES:\n" );
    Lpk_CutForEachLeaf( p->pNtk, pCut, pObj, i )
        printf( "%d,", pObj->Id );
    if ( !fLeavesOnly )
    {
        printf( "\nNODES:\n" );
        Lpk_CutForEachNode( p->pNtk, pCut, pObj, i )
        {
            printf( "%d,", pObj->Id );
            assert( Abc_ObjIsNode(pObj) );
        }
        printf( "\n" );
    }
}